

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::add_example_conditioning
               (search_private *priv,example *ec,size_t condition_on_cnt,char *condition_on_names,
               action_repr *condition_on_actions)

{
  char cVar1;
  wclass *pwVar2;
  vw *pvVar3;
  features *pfVar4;
  unsigned_long uVar5;
  example *peVar6;
  ostream *this;
  ostream *poVar7;
  uint32_t *puVar8;
  float *pfVar9;
  long lVar10;
  long lVar11;
  action_repr *paVar12;
  ulong uVar13;
  long local_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  ostream *local_98;
  example *local_90;
  char *local_88;
  action_repr *local_80;
  long local_78;
  action_repr *local_70;
  stringstream *local_68;
  string *local_60;
  char *local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  size_t local_38;
  
  if (condition_on_cnt != 0) {
    if ((priv->is_ldf == true) &&
       (pwVar2 = (ec->l).cs.costs._begin, (ec->l).cs.costs._end != pwVar2)) {
      local_48 = (ulong)(pwVar2->class_index * 0x3abb39);
    }
    else {
      local_48 = 0;
    }
    uVar13 = (priv->acset).max_bias_ngram_length;
    local_50 = (priv->acset).max_quad_ngram_length;
    if (local_50 < uVar13) {
      local_50 = uVar13;
    }
    local_40 = local_48 * 0x81904f + 0x118fd;
    local_68 = &priv->dat_new_feature_audit_ss;
    local_60 = (string *)&priv->field_0x370;
    local_98 = (ostream *)&priv->field_0x368;
    local_78 = condition_on_cnt + (condition_on_cnt == 0);
    local_c0 = 0;
    local_90 = ec;
    local_88 = condition_on_names;
    local_80 = condition_on_actions;
    local_70 = condition_on_actions;
    local_58 = condition_on_names;
    local_38 = condition_on_cnt;
    do {
      if (priv->all->audit == true) {
        local_b8[0] = local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"");
        std::__cxx11::stringbuf::str(local_60);
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0]);
        }
        std::ios::clear((int)*(undefined8 *)(*(long *)&priv->dat_new_feature_audit_ss + -0x18) +
                        (int)local_68);
        priv->dat_new_feature_feature_space = (string *)&condition_feature_space_abi_cxx11_;
      }
      if (local_50 != 0) {
        uVar13 = 0;
        lVar11 = local_40;
        paVar12 = local_70;
        do {
          if (condition_on_cnt <= local_c0 + uVar13) break;
          cVar1 = local_58[uVar13];
          lVar11 = ((long)cVar1 * 0x118fd + 0x284a40980b5) * (ulong)(paVar12->a + 0x553ad) +
                   lVar11 * 0x504c5;
          priv->dat_new_feature_ec = local_90;
          priv->dat_new_feature_idx = lVar11 * 0x1aa5cfd;
          priv->dat_new_feature_namespace = 0x86;
          priv->dat_new_feature_value = (priv->acset).feature_value;
          if (priv->all->audit == true) {
            if (uVar13 != 0) {
              local_b8[0] = (undefined1 *)CONCAT71(local_b8[0]._1_7_,0x2c);
              std::__ostream_insert<char,std::char_traits<char>>(local_98,(char *)local_b8,1);
            }
            poVar7 = local_98;
            if ((byte)(cVar1 - 0x21U) < 0x5e) {
              std::ostream::_M_insert<unsigned_long>((ulong)local_98);
            }
            else {
              local_b8[0] = (undefined1 *)CONCAT71(local_b8[0]._1_7_,0x23);
              this = std::__ostream_insert<char,std::char_traits<char>>(local_98,(char *)local_b8,1)
              ;
              poVar7 = local_98;
              std::ostream::operator<<(this,(int)cVar1);
            }
            local_b8[0] = (undefined1 *)CONCAT71(local_b8[0]._1_7_,0x3d);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_b8,1);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            condition_on_cnt = local_38;
          }
          if (uVar13 < (priv->acset).max_bias_ngram_length) {
            pvVar3 = priv->all;
            if ((pvVar3->weights).sparse == false) {
              puVar8 = &(pvVar3->weights).dense_weights._stride_shift;
            }
            else {
              puVar8 = &(pvVar3->weights).sparse_weights._stride_shift;
            }
            add_new_feature(priv,1.0,0x431c79L << ((byte)*puVar8 & 0x3f));
          }
          if (uVar13 < (priv->acset).max_quad_ngram_length) {
            GD::foreach_feature<Search::search_private,_unsigned_long,_&Search::add_new_feature>
                      (priv->all,local_90,priv);
          }
          uVar13 = uVar13 + 1;
          paVar12 = paVar12 + 1;
        } while (local_50 != uVar13);
      }
      local_c0 = local_c0 + 1;
      local_58 = local_58 + 1;
      local_70 = local_70 + 1;
    } while (local_c0 != local_78);
    if ((priv->acset).use_passthrough_repr == true) {
      lVar11 = 0;
      do {
        pfVar4 = local_80[lVar11].repr;
        if ((pfVar4 != (features *)0x0) &&
           (pfVar9 = (pfVar4->values)._begin, (pfVar4->values)._end != pfVar9)) {
          lVar10 = ((long)local_88[lVar11] * 0x80107100000000 >> 0x20) + local_48;
          uVar13 = 0;
          do {
            if (1e-10 < ABS(pfVar9[uVar13])) {
              uVar5 = (pfVar4->indicies)._begin[uVar13];
              if (priv->all->audit == true) {
                local_b8[0] = local_a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"");
                std::__cxx11::stringbuf::str(local_60);
                if (local_b8[0] != local_a8) {
                  operator_delete(local_b8[0]);
                }
                std::ios::clear((int)*(undefined8 *)(*(long *)local_68 + -0x18) + (int)local_68);
                poVar7 = local_98;
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_98,"passthrough_repr_",0x11);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                local_b8[0] = (undefined1 *)CONCAT71(local_b8[0]._1_7_,0x5f);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(char *)local_b8,1);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              }
              priv->dat_new_feature_ec = local_90;
              priv->dat_new_feature_idx = uVar5 * 0xcd1c9 + lVar10 * 0x2e2185b + 0xf4ed56e4;
              priv->dat_new_feature_namespace = 0x86;
              priv->dat_new_feature_value = (pfVar4->values)._begin[uVar13];
              pvVar3 = priv->all;
              puVar8 = &(pvVar3->weights).dense_weights._stride_shift;
              if ((pvVar3->weights).sparse != false) {
                puVar8 = &(pvVar3->weights).sparse_weights._stride_shift;
              }
              add_new_feature(priv,1.0,0x431c79L << ((byte)*puVar8 & 0x3f));
            }
            uVar13 = uVar13 + 1;
            pfVar9 = (pfVar4->values)._begin;
          } while (uVar13 < (ulong)((long)(pfVar4->values)._end - (long)pfVar9 >> 2));
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != local_78);
    }
    peVar6 = local_90;
    if (((local_90->super_example_predict).feature_space[0x86].values._end ==
         (local_90->super_example_predict).feature_space[0x86].values._begin) ||
       ((local_90->super_example_predict).feature_space[0x86].sum_feat_sq <= 0.0)) {
      features::clear((local_90->super_example_predict).feature_space + 0x86);
    }
    else {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)local_90,&conditioning_namespace);
      peVar6->total_sum_feat_sq =
           (peVar6->super_example_predict).feature_space[0x86].sum_feat_sq +
           peVar6->total_sum_feat_sq;
      peVar6->num_features =
           peVar6->num_features +
           ((long)(peVar6->super_example_predict).feature_space[0x86].values._end -
            (long)(peVar6->super_example_predict).feature_space[0x86].values._begin >> 2);
    }
  }
  return;
}

Assistant:

void add_example_conditioning(search_private& priv, example& ec, size_t condition_on_cnt,
    const char* condition_on_names, action_repr* condition_on_actions)
{
  if (condition_on_cnt == 0)
    return;

  uint64_t extra_offset = 0;
  if (priv.is_ldf)
    if (ec.l.cs.costs.size() > 0)
      extra_offset = 3849017 * ec.l.cs.costs[0].class_index;

  size_t I = condition_on_cnt;
  size_t N = max(priv.acset.max_bias_ngram_length, priv.acset.max_quad_ngram_length);
  for (size_t i = 0; i < I; i++)  // position in conditioning
  {
    uint64_t fid = 71933 + 8491087 * extra_offset;
    if (priv.all->audit)
    {
      priv.dat_new_feature_audit_ss.str("");
      priv.dat_new_feature_audit_ss.clear();
      priv.dat_new_feature_feature_space = &condition_feature_space;
    }

    for (size_t n = 0; n < N; n++)  // length of ngram
    {
      if (i + n >= I)
        break;  // no more ngrams
      // we're going to add features for the ngram condition_on_actions[i .. i+N]
      uint64_t name = condition_on_names[i + n];
      fid = fid * 328901 + 71933 * ((condition_on_actions[i + n].a + 349101) * (name + 38490137));

      priv.dat_new_feature_ec = &ec;
      priv.dat_new_feature_idx = fid * quadratic_constant;
      priv.dat_new_feature_namespace = conditioning_namespace;
      priv.dat_new_feature_value = priv.acset.feature_value;

      if (priv.all->audit)
      {
        if (n > 0)
          priv.dat_new_feature_audit_ss << ',';
        if ((33 <= name) && (name <= 126))
          priv.dat_new_feature_audit_ss << name;
        else
          priv.dat_new_feature_audit_ss << '#' << (int)name;
        priv.dat_new_feature_audit_ss << '=' << condition_on_actions[i + n].a;
      }

      // add the single bias feature
      if (n < priv.acset.max_bias_ngram_length)
        add_new_feature(priv, 1., (uint64_t)4398201 << priv.all->weights.stride_shift());
      // add the quadratic features
      if (n < priv.acset.max_quad_ngram_length)
        GD::foreach_feature<search_private, uint64_t, add_new_feature>(*priv.all, ec, priv);
    }
  }

  if (priv.acset.use_passthrough_repr)
  {
    cdbg << "BEGIN adding passthrough features" << endl;
    for (size_t i = 0; i < I; i++)
    {
      if (condition_on_actions[i].repr == nullptr)
        continue;
      features& fs = *(condition_on_actions[i].repr);
      char name = condition_on_names[i];
      for (size_t k = 0; k < fs.size(); k++)
        if ((fs.values[k] > 1e-10) || (fs.values[k] < -1e-10))
        {
          uint64_t fid = 84913 + 48371803 * (extra_offset + 8392817 * name) + 840137 * (4891 + fs.indicies[k]);
          if (priv.all->audit)
          {
            priv.dat_new_feature_audit_ss.str("");
            priv.dat_new_feature_audit_ss.clear();
            priv.dat_new_feature_audit_ss << "passthrough_repr_" << i << '_' << k;
          }

          priv.dat_new_feature_ec = &ec;
          priv.dat_new_feature_idx = fid;
          priv.dat_new_feature_namespace = conditioning_namespace;
          priv.dat_new_feature_value = fs.values[k];
          add_new_feature(priv, 1., (uint64_t)4398201 << priv.all->weights.stride_shift());
        }
    }
    cdbg << "END adding passthrough features" << endl;
  }

  features& con_fs = ec.feature_space[conditioning_namespace];
  if ((con_fs.size() > 0) && (con_fs.sum_feat_sq > 0.))
  {
    ec.indices.push_back(conditioning_namespace);
    ec.total_sum_feat_sq += con_fs.sum_feat_sq;
    ec.num_features += con_fs.size();
  }
  else
    con_fs.clear();
}